

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  RangeSelectSyntax *pRVar1;
  Token TVar2;
  BumpAllocator *unaff_retaddr;
  BumpAllocator *in_stack_00000118;
  Token *in_stack_00000120;
  ExpressionSyntax *args_1;
  __fn *args;
  
  args_1 = (ExpressionSyntax *)__child_stack;
  args = __fn;
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0x7afe0f);
  deepClone<slang::syntax::ExpressionSyntax>
            ((ExpressionSyntax *)__fn,(BumpAllocator *)__child_stack);
  TVar2 = parsing::Token::deepClone(in_stack_00000120,in_stack_00000118);
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0x7afe4c);
  deepClone<slang::syntax::ExpressionSyntax>
            ((ExpressionSyntax *)__fn,(BumpAllocator *)__child_stack);
  pRVar1 = BumpAllocator::
           emplace<slang::syntax::RangeSelectSyntax,slang::syntax::SyntaxKind_const&,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::ExpressionSyntax&>
                     (unaff_retaddr,(SyntaxKind *)args,args_1,(Token *)TVar2.info,TVar2._0_8_);
  return (int)pRVar1;
}

Assistant:

static SyntaxNode* clone(const RangeSelectSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<RangeSelectSyntax>(
        node.kind,
        *deepClone<ExpressionSyntax>(*node.left, alloc),
        node.range.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.right, alloc)
    );
}